

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_34(QPDF *pdf,char *arg2)

{
  int iVar1;
  ostream *poVar2;
  string v_string;
  int extension_level;
  allocator<char> local_99 [9];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  string local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [16];
  int local_58 [8];
  string local_38 [32];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"version: ");
  QPDF::getPDFVersion_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,(string *)&local_78);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"extension level: ");
  iVar1 = QPDF::getExtensionLevel();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar1);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  QPDF::getRoot();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"/Extensions",local_99);
  QPDFObjectHandle::getKey(local_88);
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,local_38);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string(local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  std::__cxx11::string::~string((string *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  std::__cxx11::string::~string((string *)&local_78);
  local_38._0_12_ = QPDF::getVersionAsPDFVersion();
  local_78 = local_68;
  local_70 = 0;
  local_68[0] = 0;
  PDFVersion::getVersion(local_38,(int *)&local_78);
  poVar2 = std::operator<<((ostream *)&std::cout,"As PDFVersion: ");
  poVar2 = std::operator<<(poVar2,(string *)&local_78);
  poVar2 = std::operator<<(poVar2,"/");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_58[0]);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

static void
test_34(QPDF& pdf, char const* arg2)
{
    // Look at Extensions dictionary
    std::cout << "version: " << pdf.getPDFVersion() << std::endl
              << "extension level: " << pdf.getExtensionLevel() << std::endl
              << pdf.getRoot().getKey("/Extensions").unparse() << std::endl;
    auto v = pdf.getVersionAsPDFVersion();
    std::string v_string;
    int extension_level;
    v.getVersion(v_string, extension_level);
    std::cout << "As PDFVersion: " << v_string << "/" << extension_level << std::endl;
}